

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_external.cpp
# Opt level: O3

void duckdb::RowOperations::UnswizzleHeapPointer
               (RowLayout *layout,data_ptr_t base_row_ptr,data_ptr_t base_heap_ptr,idx_t count)

{
  idx_t iVar1;
  long *plVar2;
  
  if (count != 0) {
    iVar1 = layout->row_width;
    plVar2 = (long *)(base_row_ptr + layout->heap_pointer_offset);
    do {
      *plVar2 = (long)(base_heap_ptr + *plVar2);
      plVar2 = (long *)((long)plVar2 + iVar1);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void RowOperations::UnswizzleHeapPointer(const RowLayout &layout, const data_ptr_t base_row_ptr,
                                         const data_ptr_t base_heap_ptr, const idx_t count) {
	const auto row_width = layout.GetRowWidth();
	data_ptr_t heap_ptr_ptr = base_row_ptr + layout.GetHeapOffset();
	for (idx_t i = 0; i < count; i++) {
		Store<data_ptr_t>(base_heap_ptr + Load<idx_t>(heap_ptr_ptr), heap_ptr_ptr);
		heap_ptr_ptr += row_width;
	}
}